

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O1

void absl::lts_20240722::cord_internal::anon_unknown_0::
     AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
               (CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep,
               RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
               *raw_usage)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> *in_RDX;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> *extraout_RDX;
  Nonnull<const_CordRep_*> pCVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_01;
  
  dVar8 = rep.fraction;
  pCVar5 = rep.rep;
  raw_usage->total = dVar8 * 64.0 + raw_usage->total;
  if (pCVar5->tag != '\x03') {
    __assert_fail("IsBtree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x25c,"const CordRepBtree *absl::cord_internal::CordRep::btree() const");
  }
  bVar1 = pCVar5->storage[1];
  bVar2 = pCVar5->storage[2];
  if (pCVar5->storage[0] == '\0') {
    if (bVar1 != bVar2) {
      lVar7 = (ulong)bVar1 << 3;
      do {
        iVar3 = *(int *)(*(anon_unknown_0 **)(pCVar5[1].storage + lVar7 + -0xd) + 8);
        iVar4 = iVar3 >> 1;
        auVar10._8_4_ = iVar3 >> 0x1f;
        auVar10._0_8_ = (long)iVar4;
        auVar10._12_4_ = 0x45300000;
        rep_01.fraction =
             dVar8 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0));
        rep_01.rep = (Nonnull<const_CordRep_*>)raw_usage;
        AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
                  (*(anon_unknown_0 **)(pCVar5[1].storage + lVar7 + -0xd),rep_01,in_RDX);
        lVar7 = lVar7 + 8;
        in_RDX = extraout_RDX;
      } while ((ulong)bVar2 * 8 != lVar7);
    }
  }
  else if (bVar1 != bVar2) {
    uVar6 = (ulong)((uint)bVar1 * 8);
    do {
      iVar3 = ((*(Nonnull<const_CordRep_*> *)(pCVar5[1].storage + (uVar6 - 0xd)))->refcount).count_.
              super___atomic_base<int>._M_i;
      iVar4 = iVar3 >> 1;
      auVar9._8_4_ = iVar3 >> 0x1f;
      auVar9._0_8_ = (long)iVar4;
      auVar9._12_4_ = 0x45300000;
      rep_00.fraction =
           dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0));
      rep_00.rep = *(Nonnull<const_CordRep_*> *)(pCVar5[1].storage + (uVar6 - 0xd));
      AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
                (rep_00,raw_usage);
      uVar6 = uVar6 + 8;
    } while ((ulong)bVar2 * 8 != uVar6);
  }
  return;
}

Assistant:

void AnalyzeBtree(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  raw_usage.Add(sizeof(CordRepBtree), rep);
  const CordRepBtree* tree = rep.rep->btree();
  if (tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeBtree(rep.Child(edge), raw_usage);
    }
  } else {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeDataEdge(rep.Child(edge), raw_usage);
    }
  }
}